

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O2

void anon_unknown.dwarf_266b9::show_usage(ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Benchmark 1 <type> <dic> <key> <pfxs...>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"- insert <key> and write the dictionary to <dic>")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "- MLTs can give pre-registered prefixes on <pfxs...> (optional)");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"- <type>: DaTrie type");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    SGL      : Normal");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    SGL_NL   : With node-link");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    SGL_BL   : With block-link");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    SGL_NL_BL: With node- and block-links");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    MLT      : Using the trie division");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    MLT_NL   : With node-link");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    MLT_BL   : With block-link");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    MLT_NL_BL: With node- and block-links");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Benchmark 2 <dic1> <dic2> <key>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "- delete <key> from <dic1> and write the dictionary to <dic2>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Benchmark 3 <dic> <key>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"- search <key> for <dic>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Benchmark 4 <rear> <dic1> <dic2>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "- rearrange <dic1> using <rear> and write the dictionary to <dic2>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"- <rear>: Rearrangement mode");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    1: pack()");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"    2: rebuild()");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,"Benchmark 5 <dic> <key> <pat>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "- generate a random key set registered in <dic> to <key>");
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cerr,
                           "- given <pat>, generate the patterns of random sub key sets (optional)")
  ;
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void show_usage(std::ostream& os) {
  os << "Benchmark 1 <type> <dic> <key> <pfxs...>" << std::endl;
  os << "- insert <key> and write the dictionary to <dic>" << std::endl;
  os << "- MLTs can give pre-registered prefixes on <pfxs...> (optional)" << std::endl;
  os << "- <type>: DaTrie type" << std::endl;
  os << "    SGL      : Normal" << std::endl;
  os << "    SGL_NL   : With node-link" << std::endl;
  os << "    SGL_BL   : With block-link" << std::endl;
  os << "    SGL_NL_BL: With node- and block-links" << std::endl;
  os << "    MLT      : Using the trie division" << std::endl;
  os << "    MLT_NL   : With node-link" << std::endl;
  os << "    MLT_BL   : With block-link" << std::endl;
  os << "    MLT_NL_BL: With node- and block-links" << std::endl;
  os << "Benchmark 2 <dic1> <dic2> <key>" << std::endl;
  os << "- delete <key> from <dic1> and write the dictionary to <dic2>" << std::endl;
  os << "Benchmark 3 <dic> <key>" << std::endl;
  os << "- search <key> for <dic>" << std::endl;
  os << "Benchmark 4 <rear> <dic1> <dic2>" << std::endl;
  os << "- rearrange <dic1> using <rear> and write the dictionary to <dic2>" << std::endl;
  os << "- <rear>: Rearrangement mode" << std::endl;
  os << "    1: pack()" << std::endl;
  os << "    2: rebuild()" << std::endl;
  os << "Benchmark 5 <dic> <key> <pat>" << std::endl;
  os << "- generate a random key set registered in <dic> to <key>" << std::endl;
  os << "- given <pat>, generate the patterns of random sub key sets (optional)" << std::endl;
}